

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd.c
# Opt level: O3

void gdImageGd(gdImagePtr im,FILE *outFile)

{
  gdIOCtx *out;
  
  out = gdNewFileCtx(outFile);
  if (out != (gdIOCtx *)0x0) {
    _gdImageGd(im,out);
    (*out->gd_free)(out);
    return;
  }
  return;
}

Assistant:

static void
_gdImageGd (gdImagePtr im, gdIOCtx * out)
{
	int x, y;

	_gdPutHeader (im, out);

	for (y = 0; (y < im->sy); y++) {
		for (x = 0; (x < im->sx); x++) {
			/* ROW-MAJOR IN GD 1.3 */
			if (im->trueColor) {
				gdPutInt (im->tpixels[y][x], out);
			} else {
				gdPutC ((unsigned char) im->pixels[y][x], out);
			}
		}
	}
}